

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

int mime_file_seek(void *instream,curl_off_t offset,int whence)

{
  int iVar1;
  FILE *pFVar2;
  
  if ((offset == 0 && whence == 0) && (*(long *)((long)instream + 0x40) == 0)) {
    iVar1 = 0;
  }
  else {
    if (*(long *)((long)instream + 0x40) == 0) {
      pFVar2 = fopen64(*(char **)((long)instream + 0x18),"rb");
      *(FILE **)((long)instream + 0x40) = pFVar2;
      if (pFVar2 == (FILE *)0x0) {
        return 1;
      }
    }
    iVar1 = fseek(*(FILE **)((long)instream + 0x40),offset,whence);
    iVar1 = (uint)(iVar1 != 0) * 2;
  }
  return iVar1;
}

Assistant:

static int mime_file_seek(void *instream, curl_off_t offset, int whence)
{
  curl_mimepart *part = (curl_mimepart *) instream;

  if(whence == SEEK_SET && !offset && !part->fp)
    return CURL_SEEKFUNC_OK;   /* Not open: implicitly already at BOF. */

  if(mime_open_file(part))
    return CURL_SEEKFUNC_FAIL;

  return fseek(part->fp, (long) offset, whence) ?
    CURL_SEEKFUNC_CANTSEEK : CURL_SEEKFUNC_OK;
}